

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O2

int u8_strlen(char *s)

{
  uint32_t uVar1;
  int iVar2;
  int i;
  
  i = 0;
  iVar2 = -1;
  do {
    uVar1 = u8_nextchar(s,&i);
    iVar2 = iVar2 + 1;
  } while (uVar1 != 0);
  return iVar2;
}

Assistant:

int u8_strlen(const char *s)
{
    int count = 0;
    int i = 0;

    while (u8_nextchar(s, &i) != 0)
        count++;

    return count;
}